

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

DBaseDecal * __thiscall
DBaseDecal::CloneSelf
          (DBaseDecal *this,FDecalTemplate *tpl,double ix,double iy,double iz,side_t *wall,
          F3DFloor *ffloor)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  DBaseDecal *this_00;
  TFlags local_64 [4];
  FTextureID local_60 [4];
  DBaseDecal *local_50;
  DBaseDecal *decal;
  F3DFloor *ffloor_local;
  side_t *wall_local;
  double iz_local;
  double iy_local;
  double ix_local;
  FDecalTemplate *tpl_local;
  DBaseDecal *this_local;
  
  decal = (DBaseDecal *)ffloor;
  ffloor_local = (F3DFloor *)wall;
  wall_local = (side_t *)iz;
  iz_local = iy;
  iy_local = ix;
  ix_local = (double)tpl;
  tpl_local = (FDecalTemplate *)this;
  this_00 = (DBaseDecal *)DObject::operator_new((DObject *)0x98,(size_t)tpl);
  DBaseDecal(this_00,(double)wall_local);
  local_50 = this_00;
  if (this_00 != (DBaseDecal *)0x0) {
    local_60[0] = StickToWall(this_00,(side_t *)ffloor_local,iy_local,iz_local,(F3DFloor *)decal);
    bVar3 = FTextureID::isValid(local_60);
    if (!bVar3) {
      (*(local_50->super_DThinker).super_DObject._vptr_DObject[4])();
      return (DBaseDecal *)0x0;
    }
    FDecalTemplate::ApplyToDecal((FDecalTemplate *)ix_local,local_50,(side_t *)ffloor_local);
    local_50->AlphaColor = this->AlphaColor;
    uVar1 = local_50->RenderFlags;
    uVar2 = this->RenderFlags;
    operator~((EnumType)local_64);
    uVar4 = ::TFlags::operator_cast_to_unsigned_int(local_64);
    local_50->RenderFlags = uVar1 & 0xf00 | uVar2 & uVar4;
  }
  return local_50;
}

Assistant:

DBaseDecal *DBaseDecal::CloneSelf (const FDecalTemplate *tpl, double ix, double iy, double iz, side_t *wall, F3DFloor * ffloor) const
{
	DBaseDecal *decal = new DBaseDecal(iz);
	if (decal != NULL)
	{
		if (decal->StickToWall (wall, ix, iy, ffloor).isValid())
		{
			tpl->ApplyToDecal (decal, wall);
			decal->AlphaColor = AlphaColor;
			decal->RenderFlags = (decal->RenderFlags & RF_DECALMASK) |
								 (this->RenderFlags & ~RF_DECALMASK);
		}
		else
		{
			decal->Destroy();
			return NULL;
		}
	}
	return decal;
}